

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encodeframe_utils.c
# Opt level: O0

void av1_set_ssim_rdmult(AV1_COMP *cpi,int *errorperbit,BLOCK_SIZE bsize,int mi_row,int mi_col,
                        int *rdmult)

{
  int iVar1;
  int in_ECX;
  byte in_DL;
  int *in_RSI;
  long in_RDI;
  int in_R8D;
  int *in_R9;
  double dVar2;
  int index;
  double geom_mean_of_scale;
  double num_of_mi;
  int col;
  int row;
  int num_brows;
  int num_bcols;
  int num_rows;
  int num_cols;
  int num_mi_h;
  int num_mi_w;
  BLOCK_SIZE bsize_base;
  AV1_COMMON *cm;
  int local_80;
  double local_68;
  double local_60;
  int local_54;
  int local_50;
  
  iVar1 = (*(int *)(in_RDI + 0x3c198) + 3) / 4;
  local_60 = 0.0;
  local_68 = 1.0;
  for (local_50 = in_ECX / 4;
      local_50 < (*(int *)(in_RDI + 0x3c194) + 3) / 4 &&
      local_50 <
      (int)(in_ECX / 4 +
           ("\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"[in_DL] + 3)
           / 4); local_50 = local_50 + 1) {
    for (local_54 = in_R8D / 4;
        local_54 < iVar1 &&
        local_54 <
        (int)(in_R8D / 4 +
             ("\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"[in_DL] +
             3) / 4); local_54 = local_54 + 1) {
      local_68 = *(double *)(*(long *)(in_RDI + 0x9d328) + (long)(local_50 * iVar1 + local_54) * 8)
                 * local_68;
      local_60 = local_60 + 1.0;
    }
  }
  dVar2 = pow(local_68,1.0 / local_60);
  *in_R9 = (int)((double)*in_R9 * dVar2 + 0.5);
  if (*in_R9 < 1) {
    local_80 = 0;
  }
  else {
    local_80 = *in_R9;
  }
  *in_R9 = local_80;
  av1_set_error_per_bit(in_RSI,*in_R9);
  return;
}

Assistant:

void av1_set_ssim_rdmult(const AV1_COMP *const cpi, int *errorperbit,
                         const BLOCK_SIZE bsize, const int mi_row,
                         const int mi_col, int *const rdmult) {
  const AV1_COMMON *const cm = &cpi->common;

  const BLOCK_SIZE bsize_base = BLOCK_16X16;
  const int num_mi_w = mi_size_wide[bsize_base];
  const int num_mi_h = mi_size_high[bsize_base];
  const int num_cols = (cm->mi_params.mi_cols + num_mi_w - 1) / num_mi_w;
  const int num_rows = (cm->mi_params.mi_rows + num_mi_h - 1) / num_mi_h;
  const int num_bcols = (mi_size_wide[bsize] + num_mi_w - 1) / num_mi_w;
  const int num_brows = (mi_size_high[bsize] + num_mi_h - 1) / num_mi_h;
  int row, col;
  double num_of_mi = 0.0;
  double geom_mean_of_scale = 1.0;

  // To avoid overflow of 'geom_mean_of_scale', bsize_base must be at least
  // BLOCK_8X8.
  //
  // For bsize=BLOCK_128X128 and bsize_base=BLOCK_8X8, the loop below would
  // iterate 256 times. Considering the maximum value of
  // cpi->ssim_rdmult_scaling_factors (see av1_set_mb_ssim_rdmult_scaling()),
  // geom_mean_of_scale can go up to 4.8323^256, which is within DBL_MAX
  // (maximum value a double data type can hold). If bsize_base is modified to
  // BLOCK_4X4 (minimum possible block size), geom_mean_of_scale can go up
  // to 4.8323^1024 and exceed DBL_MAX, resulting in data overflow.
  assert(bsize_base >= BLOCK_8X8);
  assert(cpi->oxcf.tune_cfg.tuning == AOM_TUNE_SSIM ||
         cpi->oxcf.tune_cfg.tuning == AOM_TUNE_IQ ||
         cpi->oxcf.tune_cfg.tuning == AOM_TUNE_SSIMULACRA2);

  for (row = mi_row / num_mi_w;
       row < num_rows && row < mi_row / num_mi_w + num_brows; ++row) {
    for (col = mi_col / num_mi_h;
         col < num_cols && col < mi_col / num_mi_h + num_bcols; ++col) {
      const int index = row * num_cols + col;
      assert(cpi->ssim_rdmult_scaling_factors[index] != 0.0);
      geom_mean_of_scale *= cpi->ssim_rdmult_scaling_factors[index];
      num_of_mi += 1.0;
    }
  }
  geom_mean_of_scale = pow(geom_mean_of_scale, (1.0 / num_of_mi));

  *rdmult = (int)((double)(*rdmult) * geom_mean_of_scale + 0.5);
  *rdmult = AOMMAX(*rdmult, 0);
  av1_set_error_per_bit(errorperbit, *rdmult);
}